

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

int32_t createLikelySubtagsString
                  (char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region,
                  int32_t regionLength,char *variants,int32_t variantsLength,char *tag,
                  int32_t tagCapacity,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  char *likelySubtags_3;
  char *likelySubtags_2;
  char *likelySubtags_1;
  char *likelySubtags;
  char likelySubtagsBuffer [157];
  char tagBuffer [157];
  int32_t regionLength_local;
  char *region_local;
  int32_t scriptLength_local;
  char *script_local;
  int32_t langLength_local;
  char *lang_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 != '\0') goto LAB_0033d302;
  if ((0 < scriptLength) && (0 < regionLength)) {
    createTagString(lang,langLength,script,scriptLength,region,regionLength,(char *)0x0,0,
                    likelySubtagsBuffer + 0x98,0x9d,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 != '\0') goto LAB_0033d302;
    pcVar3 = findLikelySubtags(likelySubtagsBuffer + 0x98,(char *)&likelySubtags,0x9d,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 != '\0') goto LAB_0033d302;
    if (pcVar3 != (char *)0x0) {
      iVar2 = createTagStringWithAlternates
                        ((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,variants,variantsLength,pcVar3,
                         tag,tagCapacity,err);
      return iVar2;
    }
  }
  if (0 < scriptLength) {
    createTagString(lang,langLength,script,scriptLength,(char *)0x0,0,(char *)0x0,0,
                    likelySubtagsBuffer + 0x98,0x9d,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 != '\0') goto LAB_0033d302;
    pcVar3 = findLikelySubtags(likelySubtagsBuffer + 0x98,(char *)&likelySubtags,0x9d,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 != '\0') goto LAB_0033d302;
    if (pcVar3 != (char *)0x0) {
      iVar2 = createTagStringWithAlternates
                        ((char *)0x0,0,(char *)0x0,0,region,regionLength,variants,variantsLength,
                         pcVar3,tag,tagCapacity,err);
      return iVar2;
    }
  }
  if (0 < regionLength) {
    createTagString(lang,langLength,(char *)0x0,0,region,regionLength,(char *)0x0,0,
                    likelySubtagsBuffer + 0x98,0x9d,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 != '\0') goto LAB_0033d302;
    pcVar3 = findLikelySubtags(likelySubtagsBuffer + 0x98,(char *)&likelySubtags,0x9d,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 != '\0') goto LAB_0033d302;
    if (pcVar3 != (char *)0x0) {
      iVar2 = createTagStringWithAlternates
                        ((char *)0x0,0,script,scriptLength,(char *)0x0,0,variants,variantsLength,
                         pcVar3,tag,tagCapacity,err);
      return iVar2;
    }
  }
  createTagString(lang,langLength,(char *)0x0,0,(char *)0x0,0,(char *)0x0,0,
                  likelySubtagsBuffer + 0x98,0x9d,err);
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    pcVar3 = findLikelySubtags(likelySubtagsBuffer + 0x98,(char *)&likelySubtags,0x9d,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 == '\0') {
      if (pcVar3 != (char *)0x0) {
        iVar2 = createTagStringWithAlternates
                          ((char *)0x0,0,script,scriptLength,region,regionLength,variants,
                           variantsLength,pcVar3,tag,tagCapacity,err);
        return iVar2;
      }
      iVar2 = u_terminateChars_63(tag,tagCapacity,0,err);
      return iVar2;
    }
  }
LAB_0033d302:
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return -1;
}

Assistant:

static int32_t U_CALLCONV
createLikelySubtagsString(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* variants,
    int32_t variantsLength,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err)
{
    /**
     * ULOC_FULLNAME_CAPACITY will provide enough capacity
     * that we can build a string that contains the language,
     * script and region code without worrying about overrunning
     * the user-supplied buffer.
     **/
    char tagBuffer[ULOC_FULLNAME_CAPACITY];
    char likelySubtagsBuffer[ULOC_FULLNAME_CAPACITY];

    if(U_FAILURE(*err)) {
        goto error;
    }

    /**
     * Try the language with the script and region first.
     **/
    if (scriptLength > 0 && regionLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            script,
            scriptLength,
            region,
            regionLength,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        NULL,
                        0,
                        NULL,
                        0,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Try the language with just the script.
     **/
    if (scriptLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            script,
            scriptLength,
            NULL,
            0,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        NULL,
                        0,
                        region,
                        regionLength,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Try the language with just the region.
     **/
    if (regionLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            NULL,
            0,
            region,
            regionLength,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        script,
                        scriptLength,
                        NULL,
                        0,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Finally, try just the language.
     **/
    {
        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            NULL,
            0,
            NULL,
            0,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        script,
                        scriptLength,
                        region,
                        regionLength,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    return u_terminateChars(
                tag,
                tagCapacity,
                0,
                err);

error:

    if (!U_FAILURE(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    return -1;
}